

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

void secp256k1_modinv64_normalize_62
               (secp256k1_modinv64_signed62 *r,int64_t sign,secp256k1_modinv64_modinfo *modinfo)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int64_t cond_add;
  int64_t cond_negate;
  
  uVar3 = r->v[4] >> 0x3f;
  uVar4 = (modinfo->modulus).v[0];
  uVar5 = (modinfo->modulus).v[1];
  uVar8 = (modinfo->modulus).v[2];
  uVar1 = (modinfo->modulus).v[3];
  uVar2 = (modinfo->modulus).v[4];
  uVar7 = sign >> 0x3f;
  uVar9 = ((uVar3 & uVar4) + r->v[0] ^ uVar7) - uVar7;
  uVar11 = ((long)uVar9 >> 0x3e) + (((uVar3 & uVar5) + r->v[1] ^ uVar7) - uVar7);
  uVar12 = ((long)uVar11 >> 0x3e) + (((uVar3 & uVar8) + r->v[2] ^ uVar7) - uVar7);
  uVar10 = ((long)uVar12 >> 0x3e) + (((uVar3 & uVar1) + r->v[3] ^ uVar7) - uVar7);
  lVar6 = ((long)uVar10 >> 0x3e) + (((uVar3 & uVar2) + r->v[4] ^ uVar7) - uVar7);
  uVar7 = lVar6 >> 0x3f;
  uVar4 = (uVar4 & uVar7) + (uVar9 & 0x3fffffffffffffff);
  uVar3 = ((long)uVar4 >> 0x3e) + (uVar5 & uVar7) + (uVar11 & 0x3fffffffffffffff);
  uVar5 = ((long)uVar3 >> 0x3e) + (uVar8 & uVar7) + (uVar12 & 0x3fffffffffffffff);
  uVar8 = ((long)uVar5 >> 0x3e) + (uVar1 & uVar7) + (uVar10 & 0x3fffffffffffffff);
  r->v[0] = uVar4 & 0x3fffffffffffffff;
  r->v[1] = uVar3 & 0x3fffffffffffffff;
  r->v[2] = uVar5 & 0x3fffffffffffffff;
  r->v[3] = uVar8 & 0x3fffffffffffffff;
  r->v[4] = ((long)uVar8 >> 0x3e) + (uVar2 & uVar7) + lVar6;
  return;
}

Assistant:

static void secp256k1_modinv64_normalize_62(secp256k1_modinv64_signed62 *r, int64_t sign, const secp256k1_modinv64_modinfo *modinfo) {
    const int64_t M62 = (int64_t)(UINT64_MAX >> 2);
    int64_t r0 = r->v[0], r1 = r->v[1], r2 = r->v[2], r3 = r->v[3], r4 = r->v[4];
    volatile int64_t cond_add, cond_negate;

#ifdef VERIFY
    /* Verify that all limbs are in range (-2^62,2^62). */
    int i;
    for (i = 0; i < 5; ++i) {
        VERIFY_CHECK(r->v[i] >= -M62);
        VERIFY_CHECK(r->v[i] <= M62);
    }
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, -2) > 0); /* r > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, 1) < 0); /* r < modulus */
#endif

    /* In a first step, add the modulus if the input is negative, and then negate if requested.
     * This brings r from range (-2*modulus,modulus) to range (-modulus,modulus). As all input
     * limbs are in range (-2^62,2^62), this cannot overflow an int64_t. Note that the right
     * shifts below are signed sign-extending shifts (see assumptions.h for tests that that is
     * indeed the behavior of the right shift operator). */
    cond_add = r4 >> 63;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    cond_negate = sign >> 63;
    r0 = (r0 ^ cond_negate) - cond_negate;
    r1 = (r1 ^ cond_negate) - cond_negate;
    r2 = (r2 ^ cond_negate) - cond_negate;
    r3 = (r3 ^ cond_negate) - cond_negate;
    r4 = (r4 ^ cond_negate) - cond_negate;
    /* Propagate the top bits, to bring limbs back to range (-2^62,2^62). */
    r1 += r0 >> 62; r0 &= M62;
    r2 += r1 >> 62; r1 &= M62;
    r3 += r2 >> 62; r2 &= M62;
    r4 += r3 >> 62; r3 &= M62;

    /* In a second step add the modulus again if the result is still negative, bringing
     * r to range [0,modulus). */
    cond_add = r4 >> 63;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    /* And propagate again. */
    r1 += r0 >> 62; r0 &= M62;
    r2 += r1 >> 62; r1 &= M62;
    r3 += r2 >> 62; r2 &= M62;
    r4 += r3 >> 62; r3 &= M62;

    r->v[0] = r0;
    r->v[1] = r1;
    r->v[2] = r2;
    r->v[3] = r3;
    r->v[4] = r4;

#ifdef VERIFY
    VERIFY_CHECK(r0 >> 62 == 0);
    VERIFY_CHECK(r1 >> 62 == 0);
    VERIFY_CHECK(r2 >> 62 == 0);
    VERIFY_CHECK(r3 >> 62 == 0);
    VERIFY_CHECK(r4 >> 62 == 0);
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, 0) >= 0); /* r >= 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, 1) < 0); /* r < modulus */
#endif
}